

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

char * sx_toupper(char *dst,int dst_sz,char *str)

{
  char cVar1;
  ulong uVar2;
  
  cVar1 = *str;
  if (dst_sz < 2 || cVar1 == '\0') {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      dst[uVar2] = (0x19 < (byte)(cVar1 + 0x9fU)) * ' ' + cVar1 + -0x20;
      cVar1 = str[uVar2 + 1];
      uVar2 = uVar2 + 1;
      if (cVar1 == '\0') break;
    } while (uVar2 < dst_sz - 1);
  }
  dst[uVar2] = '\0';
  return dst;
}

Assistant:

char* sx_toupper(char* dst, int dst_sz, const char* str)
{
    int offset = 0;
    int dst_max = dst_sz - 1;
    while (*str && offset < dst_max) {
        dst[offset++] = sx_toupperchar(*str);
        ++str;
    }
    dst[offset] = '\0';
    return dst;
}